

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel_list.c
# Opt level: O0

exr_result_t
exr_attr_chlist_duplicate(exr_context_t ctxt,exr_attr_chlist_t *chl,exr_attr_chlist_t *srcchl)

{
  int iVar1;
  exr_result_t eVar2;
  exr_attr_chlist_t *in_RDX;
  exr_context_t in_RSI;
  exr_attr_chlist_entry_t *cur;
  int c;
  int numchans;
  exr_result_t rv;
  exr_attr_chlist_t *in_stack_00000040;
  exr_context_t in_stack_00000048;
  int32_t in_stack_00000060;
  int32_t in_stack_00000068;
  int local_2c;
  int in_stack_ffffffffffffffdc;
  exr_result_t local_4;
  
  if ((in_RSI == (exr_context_t)0x0) || (in_RDX == (exr_attr_chlist_t *)0x0)) {
    local_4 = 3;
  }
  else {
    iVar1 = in_RDX->num_channels;
    local_4 = exr_attr_chlist_init(in_RSI,in_RDX,in_stack_ffffffffffffffdc);
    if (local_4 == 0) {
      local_2c = 0;
      while( true ) {
        if (iVar1 <= local_2c) break;
        eVar2 = exr_attr_chlist_add_with_length
                          (in_stack_00000048,in_stack_00000040,(char *)ctxt,chl._4_4_,
                           (exr_pixel_type_t)chl,srcchl._4_4_,in_stack_00000060,in_stack_00000068);
        if (eVar2 != 0) {
          exr_attr_chlist_destroy(in_RSI,in_RDX);
          return eVar2;
        }
        local_2c = local_2c + 1;
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_chlist_duplicate (
    exr_context_t ctxt, exr_attr_chlist_t* chl, const exr_attr_chlist_t* srcchl)
{
    exr_result_t rv;
    int          numchans;

    if (!chl || !srcchl) return EXR_ERR_INVALID_ARGUMENT;

    numchans = srcchl->num_channels;
    rv       = exr_attr_chlist_init (ctxt, chl, numchans);
    if (rv != EXR_ERR_SUCCESS) return rv;

    for (int c = 0; c < numchans; ++c)
    {
        const exr_attr_chlist_entry_t* cur = srcchl->entries + c;

        rv = exr_attr_chlist_add_with_length (
            ctxt,
            chl,
            cur->name.str,
            cur->name.length,
            cur->pixel_type,
            (exr_perceptual_treatment_t) cur->p_linear,
            cur->x_sampling,
            cur->y_sampling);
        if (rv != EXR_ERR_SUCCESS)
        {
            exr_attr_chlist_destroy (ctxt, chl);
            return rv;
        }
    }
    return rv;
}